

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

void __thiscall
cs_impl::any::holder<cs::type_t>::holder<cs::struct_builder_const&,cs::type_id_const&>
          (holder<cs::type_t> *this,struct_builder *args,type_id *args_1)

{
  baseHolder *in_RDI;
  type_id *i;
  struct_builder *in_stack_ffffffffffffffb8;
  type_t *in_stack_ffffffffffffffc0;
  
  baseHolder::baseHolder(in_RDI);
  in_RDI->_vptr_baseHolder = (_func_int **)&PTR__holder_003b6c28;
  i = (type_id *)(in_RDI + 1);
  std::function<cs_impl::any()>::function<cs::struct_builder_const&,void>
            (&in_stack_ffffffffffffffc0->constructor,in_stack_ffffffffffffffb8);
  cs::type_t::type_t(in_stack_ffffffffffffffc0,
                     (function<cs_impl::any_()> *)in_stack_ffffffffffffffb8,i);
  std::function<cs_impl::any_()>::~function((function<cs_impl::any_()> *)0x2e968d);
  return;
}

Assistant:

explicit holder(ArgsT &&...args):mDat(std::forward<ArgsT>(args)...) {}